

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O1

uint64_t farmhashna::Hash64(char *s,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar6 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                  (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar6 >> 0x2f ^ uVar6) * -0x651e95c4d06fbfb1;
        }
        lVar4 = len * 2 + -0x651e95c4d06fbfb1;
        uVar6 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar4;
        uVar6 = (uVar6 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar6) * lVar4;
        uVar6 = uVar6 >> 0x2f ^ uVar6;
      }
      else {
        lVar4 = len * 2 + -0x651e95c4d06fbfb1;
        uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar6 = *(ulong *)(s + (len - 8));
        uVar2 = ((uVar1 >> 0x19 | uVar1 << 0x27) + uVar6) * lVar4;
        uVar6 = ((uVar6 >> 0x25 | uVar6 << 0x1b) * lVar4 + uVar1 ^ uVar2) * lVar4;
        uVar6 = (uVar6 >> 0x2f ^ uVar2 ^ uVar6) * lVar4;
        uVar6 = uVar6 >> 0x2f ^ uVar6;
      }
      goto LAB_0017d030;
    }
    lVar4 = len * 2 + -0x651e95c4d06fbfb1;
    uVar1 = *(long *)(s + (len - 8)) * lVar4;
    uVar6 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar2 = (uVar1 >> 0x1e | uVar1 << 0x22) + (uVar6 >> 0x2b | uVar6 * 0x200000) +
            *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar6 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar1 = (uVar6 >> 0x12 | uVar6 << 0x2e) + *(long *)s * -0x4b6d499041670d8d + uVar1;
  }
  else {
    if (0x40 < len) {
      uVar1 = len - 1 & 0xffffffffffffffc0;
      uVar6 = (ulong)((uint)(len - 1) & 0x3f);
      if (s + (len - 0x40) == s + (uVar6 - 0x3f) + uVar1) {
        lVar4 = uVar6 + uVar1;
        lVar8 = *(long *)s + 0x1529cba0ca458ff;
        lVar10 = 0x226bb95b4e64b6d4;
        uVar12 = 0x134a747f856d0526;
        uVar15 = 0;
        lVar7 = 0;
        uVar2 = 0;
        lVar14 = 0;
        lVar3 = 0;
        do {
          uVar9 = lVar8 + lVar14 + lVar10 + *(long *)(s + uVar15 + 8);
          uVar11 = lVar10 + lVar3 + *(long *)(s + uVar15 + 0x30);
          lVar10 = lVar14 + *(long *)(s + uVar15 + 0x28) +
                   (uVar11 >> 0x2a | uVar11 * 0x400000) * -0x4b6d499041670d8d;
          uVar11 = uVar12 + lVar7;
          lVar3 = lVar3 * -0x4b6d499041670d8d + *(long *)(s + uVar15);
          uVar13 = *(long *)(s + uVar15 + 8) + lVar3 + *(long *)(s + uVar15 + 0x10);
          lVar14 = uVar13 + *(long *)(s + uVar15 + 0x18);
          uVar12 = (uVar9 >> 0x25 | uVar9 * 0x8000000) * -0x4b6d499041670d8d ^ uVar2;
          lVar8 = (uVar11 >> 0x21 | uVar11 * 0x80000000) * -0x4b6d499041670d8d;
          uVar11 = lVar7 + lVar3 + *(long *)(s + uVar15 + 0x18) + uVar12;
          lVar3 = lVar3 + (uVar13 >> 0x2c | uVar13 * 0x100000) + (uVar11 >> 0x15 | uVar11 << 0x2b);
          lVar5 = uVar2 + lVar8 + *(long *)(s + uVar15 + 0x20);
          uVar11 = *(long *)(s + uVar15 + 0x10) + lVar5 + lVar10 + *(long *)(s + uVar15 + 0x38);
          uVar2 = *(long *)(s + uVar15 + 0x28) + *(long *)(s + uVar15 + 0x30) + lVar5;
          lVar7 = uVar2 + *(long *)(s + uVar15 + 0x38);
          uVar2 = lVar5 + (uVar2 >> 0x2c | uVar2 * 0x100000) + (uVar11 >> 0x15 | uVar11 << 0x2b);
          uVar15 = uVar15 + 0x40;
        } while (uVar1 != uVar15);
        lVar5 = (uVar12 & 0xff) * 2 + -0x4b6d499041670d8d;
        lVar14 = lVar14 + lVar7 + uVar6;
        lVar7 = lVar7 + uVar6 + lVar14;
        uVar6 = lVar8 + lVar10 + *(long *)(s + lVar4 + -0x37) + lVar14;
        uVar1 = lVar10 + lVar3 + *(long *)(s + lVar4 + -0xf);
        uVar11 = uVar2 * 9 ^ (uVar6 >> 0x25 | uVar6 * 0x8000000) * lVar5;
        uVar9 = lVar14 * 9 + *(long *)(s + lVar4 + -0x17) +
                (uVar1 >> 0x2a | uVar1 * 0x400000) * lVar5;
        uVar12 = uVar12 + lVar7;
        uVar12 = uVar12 >> 0x21 | uVar12 * 0x80000000;
        lVar3 = lVar3 * lVar5 + *(long *)(s + lVar4 + -0x3f);
        uVar15 = lVar7 + lVar3 + uVar11 + *(long *)(s + lVar4 + -0x27);
        uVar13 = *(long *)(s + lVar4 + -0x37) + *(long *)(s + lVar4 + -0x2f) + lVar3;
        lVar7 = uVar12 * lVar5 + uVar2 + *(long *)(s + lVar4 + -0x1f);
        uVar2 = *(long *)(s + lVar4 + -0x2f) + uVar9 + *(long *)(s + lVar4 + -7) + lVar7;
        uVar6 = *(long *)(s + lVar4 + -0x17) + *(long *)(s + lVar4 + -0xf) + lVar7;
        uVar1 = uVar6 + *(long *)(s + lVar4 + -7);
        uVar6 = (uVar6 >> 0x2c | uVar6 * 0x100000) + lVar7 + (uVar2 >> 0x15 | uVar2 << 0x2b);
        uVar2 = (uVar13 + *(long *)(s + lVar4 + -0x27) ^ uVar1) * lVar5;
        uVar2 = (uVar2 >> 0x2f ^ uVar1 ^ uVar2) * lVar5;
        uVar1 = ((uVar13 >> 0x2c | uVar13 * 0x100000) + lVar3 + (uVar15 >> 0x15 | uVar15 << 0x2b) ^
                uVar6) * lVar5;
        uVar6 = (uVar1 >> 0x2f ^ uVar6 ^ uVar1) * lVar5;
        uVar6 = ((uVar6 >> 0x2f ^ uVar6) + uVar12) * lVar5;
        uVar1 = ((uVar9 >> 0x2f ^ uVar9) * -0x3c5a37a36834ced9 + uVar11 +
                 (uVar2 >> 0x2f ^ uVar2) * lVar5 ^ uVar6) * lVar5;
        uVar6 = (uVar1 >> 0x2f ^ uVar6 ^ uVar1) * lVar5;
        return (uVar6 >> 0x2f ^ uVar6) * lVar5;
      }
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash.cc"
                    ,0x226,"uint64_t farmhashna::Hash64(const char *, size_t)");
    }
    lVar4 = len * 2 + -0x651e95c4d06fbfb1;
    lVar3 = *(long *)s * -0x651e95c4d06fbfb1;
    uVar1 = *(long *)(s + (len - 8)) * lVar4;
    uVar6 = lVar3 + *(long *)(s + 8);
    uVar6 = (uVar1 >> 0x1e | uVar1 << 0x22) + (uVar6 >> 0x2b | uVar6 * 0x200000) +
            *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1;
    uVar2 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
    uVar1 = (uVar2 >> 0x12 | uVar2 << 0x2e) + lVar3 + uVar1;
    uVar2 = (uVar6 ^ uVar1) * lVar4;
    uVar2 = (uVar2 >> 0x2f ^ uVar1 ^ uVar2) * lVar4;
    uVar1 = (uVar6 + *(long *)(s + (len - 0x20))) * lVar4;
    uVar6 = *(long *)(s + 0x10) * lVar4 + *(long *)(s + 0x18);
    uVar2 = (uVar1 >> 0x1e | uVar1 << 0x22) + (uVar6 >> 0x2b | uVar6 * 0x200000) +
            ((uVar2 >> 0x2f ^ uVar2) * lVar4 + *(long *)(s + (len - 0x18))) * lVar4;
    uVar6 = lVar3 + *(long *)(s + 0x18);
    uVar1 = (uVar6 >> 0x12 | uVar6 << 0x2e) + *(long *)(s + 0x10) * lVar4 + uVar1;
  }
  uVar6 = (uVar2 ^ uVar1) * lVar4;
  uVar6 = (uVar6 >> 0x2f ^ uVar1 ^ uVar6) * lVar4;
  uVar6 = uVar6 >> 0x2f ^ uVar6;
LAB_0017d030:
  return uVar6 * lVar4;
}

Assistant:

uint64_t Hash64(const char *s, size_t len) {
  const uint64_t seed = 81;
  if (len <= 32) {
    if (len <= 16) {
      return HashLen0to16(s, len);
    } else {
      return HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 56 bytes: v, w, x, y, and z.
  uint64_t x = seed;
  uint64_t y = seed * k1 + 113;
  uint64_t z = ShiftMix(y * k2 + 113) * k2;
  pair<uint64_t, uint64_t> v = make_pair(0, 0);
  pair<uint64_t, uint64_t> w = make_pair(0, 0);
  x = x * k2 + Fetch(s);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    x = Rotate(x + y + v.first + Fetch(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
    std::swap(z, x);
    s += 64;
  } while (s != end);
  uint64_t mul = k1 + ((z & 0xff) << 1);
  // Make s point to the last 64 bytes of input.
  s = last64;
  w.first += ((len - 1) & 63);
  v.first += w.first;
  w.first += v.first;
  x = Rotate(x + y + v.first + Fetch(s + 8), 37) * mul;
  y = Rotate(y + v.second + Fetch(s + 48), 42) * mul;
  x ^= w.second * 9;
  y += v.first * 9 + Fetch(s + 40);
  z = Rotate(z + w.first, 33) * mul;
  v = WeakHashLen32WithSeeds(s, v.second * mul, x + w.first);
  w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch(s + 16));
  std::swap(z, x);
  return HashLen16(HashLen16(v.first, w.first, mul) + ShiftMix(y) * k0 + z,
                   HashLen16(v.second, w.second, mul) + x,
                   mul);
}